

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O0

bool __thiscall Uri::Uri::operator==(Uri *this,Uri *that)

{
  __type _Var1;
  __type local_19;
  Uri *that_local;
  Uri *this_local;
  
  _Var1 = std::operator==(&this->scheme,&that->scheme);
  local_19 = false;
  if (_Var1) {
    _Var1 = std::operator==(&this->authority,&that->authority);
    local_19 = false;
    if (_Var1) {
      _Var1 = std::operator==(&this->path,&that->path);
      local_19 = false;
      if (_Var1) {
        _Var1 = std::operator==(&this->query,&that->query);
        local_19 = false;
        if (_Var1) {
          local_19 = std::operator==(&this->fragment,&that->fragment);
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool Uri::operator == (Uri &that) {
    return scheme == that.scheme
           && authority == that.authority
           && path == that.path
           && query == that.query
           && fragment == that.fragment;
}